

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_acceptance.c
# Opt level: O0

REF_STATUS ref_acceptance_u_lisbon(REF_DBL x,REF_DBL y,REF_DBL *scalar)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double local_60;
  double local_50;
  REF_DBL v;
  REF_DBL u;
  REF_DBL nu;
  REF_DBL sigma;
  REF_DBL *scalar_local;
  REF_DBL y_local;
  REF_DBL x_local;
  
  if (x * 1e+20 <= 0.0) {
    local_50 = -(x * 1e+20);
  }
  else {
    local_50 = x * 1e+20;
  }
  local_60 = y;
  if (y <= 0.0) {
    local_60 = -y;
  }
  if (local_60 < local_50) {
    dVar1 = (y * 4.0) / x;
    dVar2 = erf(dVar1);
    dVar3 = sqrt(3.14159265358979);
    dVar1 = exp(-dVar1 * dVar1);
    dVar1 = (1.0 / (dVar3 * 4.0)) * (1.0 - dVar1);
    dVar1 = sqrt(dVar2 * dVar2 + dVar1 * dVar1);
    *scalar = dVar1;
  }
  else {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_acceptance.c",
           0xe3,"ref_acceptance_u_lisbon","lisbon not defined for x=0");
  }
  x_local._4_4_ = (uint)(local_60 >= local_50);
  return x_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_acceptance_u_lisbon(REF_DBL x, REF_DBL y,
                                                  REF_DBL *scalar) {
  REF_DBL sigma, nu, u, v;
  sigma = 4.0;
  RAS(ref_math_divisible(y, x), "lisbon not defined for x=0");
  nu = sigma * y / x;
  u = erf(nu);
  v = 1.0 / (sigma * sqrt(ref_math_pi)) * (1.0 - exp(-nu * nu));
  *scalar = sqrt(u * u + v * v);

  return REF_SUCCESS;
}